

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterB.c
# Opt level: O1

int Intb_ManGetGlobalVar(Intb_Man_t *p,int Var)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (p->pVarTypes[Var] < 0) {
    uVar1 = ~p->pVarTypes[Var];
    if (p->vVarsAB->nSize <= (int)uVar1) {
      __assert_fail("VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satInterB.c"
                    ,0x229,"int Intb_ManGetGlobalVar(Intb_Man_t *, int)");
    }
  }
  return uVar1;
}

Assistant:

int Intb_ManGetGlobalVar( Intb_Man_t * p, int Var )
{
    int VarAB;
    if ( p->pVarTypes[Var] >= 0 ) // global var
        return -1;
    VarAB = -p->pVarTypes[Var]-1;
    assert( VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB) );
    return VarAB;
}